

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabinkarphash.h
# Opt level: O3

unsigned_long_long __thiscall
KarpRabinHash<unsigned_long_long,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (KarpRabinHash<unsigned_long_long,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  _Map_pointer ppuVar3;
  ulong uVar4;
  ulong uVar5;
  _Elt_pointer puVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  _Elt_pointer puVar10;
  ulong uVar11;
  ulong uVar12;
  
  ppuVar1 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar2 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppuVar3 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_start._M_node;
  puVar10 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_start._M_last +
            (long)((c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Deque_impl_data._M_finish._M_cur +
                  ((((((ulong)((long)ppuVar1 - (long)ppuVar3) >> 3) - 1) +
                    (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x200 -
                   (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_first) - (long)puVar2));
  if (puVar10 == (_Elt_pointer)0x0) {
    return 0;
  }
  uVar4 = *(ulong *)(this + 0x810);
  uVar9 = 0;
  uVar5 = 0;
  do {
    uVar11 = 1;
    if (puVar10 + ~uVar9 != (_Elt_pointer)0x0) {
      uVar8 = 1;
      do {
        uVar11 = uVar11 * 0x25 & uVar4;
        puVar6 = (_Elt_pointer)(ulong)uVar8;
        uVar8 = uVar8 + 1;
      } while (puVar6 < puVar10 + ~uVar9);
    }
    puVar6 = puVar2 + (uVar9 - (long)(c->
                                     super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Deque_impl_data._M_start._M_first);
    if ((long)puVar6 < 0) {
      uVar12 = (long)puVar6 >> 9;
LAB_0010900d:
      pbVar7 = ppuVar3[uVar12] + (long)(puVar6 + uVar12 * -0x200);
    }
    else {
      if ((_Elt_pointer)0x1ff < puVar6) {
        uVar12 = (ulong)puVar6 >> 9;
        goto LAB_0010900d;
      }
      pbVar7 = puVar2 + uVar9;
    }
    uVar5 = uVar5 + (uVar11 * *(long *)(this + (ulong)*pbVar7 * 8 + 0x10) & uVar4) & uVar4;
    uVar9 = uVar9 + 1;
    if (puVar10 <= (_Elt_pointer)(uVar9 & 0xffffffff)) {
      return uVar5;
    }
  } while( true );
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      hashvaluetype x(1);
      for (uint j = 0; j < c.size() - 1 - k; ++j) {
        x = (x * B) & HASHMASK;
      }
      x = (x * hasher.hashvalues[c[k]]) & HASHMASK;
      answer = (answer + x) & HASHMASK;
    }
    return answer;
  }